

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

void __thiscall Promise::Resolve(Promise *this,shared_ptr<Promise> *next)

{
  vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_> *__x;
  pointer psVar1;
  shared_ptr<Promise> *child;
  pointer psVar2;
  vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_> *__range1;
  __shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  
  std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,&next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>);
  Register((Promise *)&stack0xffffffffffffffc8,(shared_ptr<Promise> *)&_Stack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  __x = &this->children;
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::operator=
            (&((next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->children,__x
            );
  psVar1 = (this->children).
           super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->children).
                super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((psVar2->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->parent)
                .super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>,
               &next->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::clear(__x);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
            (__x,next);
  Resolve(this);
  return;
}

Assistant:

void Resolve(const PromisePtr& next) {
    Register(next);

    next->children = children;
    for (auto& child : children) {
      child->parent = next;
    }
    children.clear();
    children.push_back(next);

    Resolve();
  }